

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

char * __thiscall String::findLast(String *this,char c)

{
  char *pcVar1;
  char *p;
  char *start;
  char c_local;
  String *this_local;
  
  pcVar1 = this->data->str + this->data->len;
  do {
    pcVar1 = pcVar1 + 0xffffffffffffffff;
    if (pcVar1 < this->data->str) {
      return (char *)0x0;
    }
  } while (*pcVar1 != c);
  return pcVar1;
}

Assistant:

const char* findLast(char c) const
  {
    for(const char * start = data->str, * p = data->str + data->len - 1; p >= start; --p)
      if(*p == c)
        return p;
    return 0;
  }